

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O1

StringRef __thiscall llvm::ARM::getArchExtFeature(ARM *this,StringRef ArchExt)

{
  char *pcVar1;
  int iVar2;
  undefined4 extraout_var;
  ARM *pAVar3;
  char *pcVar4;
  long lVar5;
  char *__s;
  bool bVar6;
  StringRef SVar7;
  
  pcVar4 = ArchExt.Data;
  if (((char *)0x1 < pcVar4) && (*(short *)this == 0x6f6e)) {
    lVar5 = 0x20;
    bVar6 = false;
    pAVar3 = this + 2;
    do {
      pcVar1 = *(char **)(&UNK_0018b0b8 + lVar5);
      __s = *(char **)((long)&(anonymous_namespace)::ARCHExtNames + lVar5);
      pAVar3 = (ARM *)CONCAT71((int7)((ulong)pAVar3 >> 8),__s != (char *)0x0);
      if (pcVar4 + -2 == pcVar1 && __s != (char *)0x0) {
        if (pcVar1 != (char *)0x0) {
          iVar2 = bcmp(this + 2,*(void **)(&UNK_0018b0b0 + lVar5),(size_t)pcVar1);
          pAVar3 = (ARM *)CONCAT44(extraout_var,iVar2);
          if (iVar2 != 0) goto LAB_00151e3b;
        }
        pAVar3 = (ARM *)strlen(__s);
        break;
      }
LAB_00151e3b:
      lVar5 = lVar5 + 0x28;
      bVar6 = lVar5 == 0x368;
    } while (!bVar6);
    if (!bVar6) goto LAB_00151ebd;
  }
  lVar5 = 0x18;
  pAVar3 = (ARM *)0x0;
  do {
    pcVar1 = *(char **)(&UNK_0018b0c0 + lVar5);
    __s = *(char **)((long)&(anonymous_namespace)::ARCHExtNames + lVar5);
    if ((pcVar1 == pcVar4 && __s != (char *)0x0) &&
       ((pcVar1 == (char *)0x0 ||
        (iVar2 = bcmp(this,*(void **)(&UNK_0018b0b8 + lVar5),(size_t)pcVar1), iVar2 == 0)))) {
      pAVar3 = (ARM *)strlen(__s);
      goto LAB_00151ebd;
    }
    lVar5 = lVar5 + 0x28;
  } while (lVar5 != 0x360);
  __s = (char *)0x0;
LAB_00151ebd:
  SVar7.Length = (size_t)pAVar3;
  SVar7.Data = __s;
  return SVar7;
}

Assistant:

StringRef llvm::ARM::getArchExtFeature(StringRef ArchExt) {
  if (ArchExt.startswith("no")) {
    StringRef ArchExtBase(ArchExt.substr(2));
    for (const auto AE : ARCHExtNames) {
      if (AE.NegFeature && ArchExtBase == AE.getName())
        return StringRef(AE.NegFeature);
    }
  }
  for (const auto AE : ARCHExtNames) {
    if (AE.Feature && ArchExt == AE.getName())
      return StringRef(AE.Feature);
  }

  return StringRef();
}